

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFontVariableAxis>::reallocateAndGrow
          (QArrayDataPointer<QFontVariableAxis> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFontVariableAxis> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QFontVariableAxis> *this_00;
  QFontVariableAxis *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QFontVariableAxis> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QFontVariableAxis> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QFontVariableAxis> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QFontVariableAxis> *in_stack_ffffffffffffff88;
  QGenericArrayOps<QFontVariableAxis> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QFontVariableAxis> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QFontVariableAxis> *)
                  operator->((QArrayDataPointer<QFontVariableAxis> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFontVariableAxis> *)0xa6fc2c);
        begin((QArrayDataPointer<QFontVariableAxis> *)0xa6fc3b);
        QtPrivate::QGenericArrayOps<QFontVariableAxis>::copyAppend
                  (this_00,(QFontVariableAxis *)in_stack_ffffffffffffff88,
                   (QFontVariableAxis *)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QFontVariableAxis> *)
             operator->((QArrayDataPointer<QFontVariableAxis> *)&stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QFontVariableAxis> *)0xa6fc74);
        begin((QArrayDataPointer<QFontVariableAxis> *)0xa6fc83);
        QtPrivate::QGenericArrayOps<QFontVariableAxis>::moveAppend
                  (in_stack_ffffffffffffff90,b,(QFontVariableAxis *)in_stack_ffffffffffffff80);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QFontVariableAxis> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QFontVariableAxis> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QFontVariableAxis>::reallocate
              ((QMovableArrayOps<QFontVariableAxis> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }